

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsModule.cpp
# Opt level: O1

void __thiscall Js::AsmJsModuleInfo::SetVarImportCount(AsmJsModuleInfo *this,int val)

{
  undefined1 auVar1 [16];
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  Recycler *this_00;
  ModuleVarImport *pMVar6;
  Type *addr;
  size_t size;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  if ((this->mVarImports).ptr != (ModuleVarImport *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
                                ,0x68a,"(mVarImports == nullptr)","mVarImports == nullptr");
    if (!bVar3) goto LAB_009582e6;
    *puVar5 = 0;
  }
  this->mVarImportCount = val;
  local_50 = (undefined1  [8])&ModuleVarImport::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_46bf060;
  data.filename._0_4_ = 0x68c;
  data.plusSize = (long)val;
  this_00 = Memory::Recycler::TrackAllocInfo(this->mRecycler,(TrackAllocData *)local_50);
  if (val == 0) {
    Memory::Recycler::ClearTrackAllocInfo(this_00,(TrackAllocData *)0x0);
    pMVar6 = (ModuleVarImport *)&DAT_00000008;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)val;
    size = 0xffffffffffffffff;
    if (SUB168(auVar1 * ZEXT816(0xc),8) == 0) {
      size = SUB168(auVar1 * ZEXT816(0xc),0);
    }
    BVar4 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar3) goto LAB_009582e6;
      *puVar5 = 0;
    }
    if (size == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fc,"(byteSize != 0 || !TAllocator::FakeZeroLengthArray)",
                                  "byteSize != 0 || !TAllocator::FakeZeroLengthArray");
      if (!bVar3) goto LAB_009582e6;
      *puVar5 = 0;
    }
    pMVar6 = (ModuleVarImport *)
             Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                       (this_00,size);
    if (pMVar6 == (ModuleVarImport *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar3) {
LAB_009582e6:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
  }
  addr = &this->mVarImports;
  Memory::Recycler::WBSetBit((char *)addr);
  addr->ptr = pMVar6;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  return;
}

Assistant:

void AsmJsModuleInfo::SetVarImportCount(int val)
    {
        Assert(mVarImports == nullptr);
        mVarImportCount = val;
        mVarImports = RecyclerNewArray(mRecycler, ModuleVarImport, val);
    }